

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void sorter_merge_sort_recursive(int64_t *newdst,int64_t *dst,size_t size)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong size_00;
  
  if (size < 2) {
    return;
  }
  if (size < 0x11) {
    sorter_binary_insertion_sort_start(dst,1,size);
    return;
  }
  size_00 = size >> 1;
  sorter_merge_sort_recursive(newdst,dst,size_00);
  sorter_merge_sort_recursive(newdst,dst + size_00,size - size_00);
  uVar2 = 0;
  sVar4 = 0;
  uVar3 = size_00;
  do {
    if (uVar2 < size_00) {
      if (size <= uVar3) {
        lVar5 = dst[uVar2];
LAB_0010c853:
        uVar2 = uVar2 + 1;
        goto LAB_0010c856;
      }
      lVar5 = dst[uVar2];
      plVar1 = dst + uVar3;
      if (lVar5 <= *plVar1) goto LAB_0010c853;
      uVar3 = uVar3 + 1;
      newdst[sVar4] = *plVar1;
    }
    else {
      lVar5 = dst[uVar3];
      uVar3 = uVar3 + 1;
LAB_0010c856:
      newdst[sVar4] = lVar5;
    }
    sVar4 = sVar4 + 1;
    if (size == sVar4) {
      memcpy(dst,newdst,size << 3);
      return;
    }
  } while( true );
}

Assistant:

void MERGE_SORT_RECURSIVE(SORT_TYPE *newdst, SORT_TYPE *dst,
                          const size_t size) {
  const size_t middle = size / 2;
  size_t out = 0;
  size_t i = 0;
  size_t j = middle;

  /* don't bother sorting an array of size <= 1 */
  if (size <= 1) {
    return;
  }

  if (size <= SMALL_SORT_BND) {
    BINARY_INSERTION_SORT(dst, size);
    return;
  }

  MERGE_SORT_RECURSIVE(newdst, dst, middle);
  MERGE_SORT_RECURSIVE(newdst, &dst[middle], size - middle);

  while (out != size) {
    if (i < middle) {
      if (j < size) {
        if (SORT_CMP(dst[i], dst[j]) <= 0) {
          newdst[out] = dst[i++];
        } else {
          newdst[out] = dst[j++];
        }
      } else {
        newdst[out] = dst[i++];
      }
    } else {
      newdst[out] = dst[j++];
    }

    out++;
  }

  SORT_TYPE_CPY(dst, newdst, size);
}